

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event.h
# Opt level: O0

void __thiscall CurrentEvent::CurrentEvent(CurrentEvent *this,double n_current,double n_weight)

{
  Clock *this_00;
  Event *in_RDI;
  _func_int **in_XMM0_Qa;
  double dVar1;
  undefined8 in_XMM1_Qa;
  
  Event::Event(in_RDI);
  in_RDI->_vptr_Event = (_func_int **)&PTR_setWeight_00127b48;
  in_RDI[1]._vptr_Event = (_func_int **)0x0;
  *(undefined8 *)&in_RDI[1].type = 0;
  in_RDI->type = Current;
  this_00 = Clock::getInstance();
  dVar1 = Clock::getCurrentTime(this_00);
  in_RDI->eventTime = dVar1;
  in_RDI[1]._vptr_Event = in_XMM0_Qa;
  *(undefined8 *)&in_RDI[1].type = in_XMM1_Qa;
  return;
}

Assistant:

CurrentEvent(double n_current, double n_weight) {
        type = EventType::Current;
        eventTime = Clock::getInstance()->getCurrentTime();
        current = n_current;
        weight = n_weight;
    }